

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void analyzeDatabase(Parse *pParse,int iDb)

{
  int iStatCur;
  int iVar1;
  Schema *pSVar2;
  HashElem *pHVar3;
  
  pSVar2 = pParse->db->aDb[iDb].pSchema;
  sqlite3BeginWriteOperation(pParse,0,iDb);
  iStatCur = pParse->nTab;
  pParse->nTab = iStatCur + 3;
  openStatTable(pParse,iDb,iStatCur,(char *)0x0,(char *)0x0);
  iVar1 = pParse->nMem;
  pHVar3 = (HashElem *)&(pSVar2->tblHash).first;
  while (pHVar3 = pHVar3->next, pHVar3 != (HashElem *)0x0) {
    analyzeOneTable(pParse,(Table *)pHVar3->data,(Index *)0x0,iStatCur,iVar1 + 1);
  }
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeDatabase(Parse *pParse, int iDb){
  sqlite3 *db = pParse->db;
  Schema *pSchema = db->aDb[iDb].pSchema;    /* Schema of database iDb */
  HashElem *k;
  int iStatCur;
  int iMem;

  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  openStatTable(pParse, iDb, iStatCur, 0, 0);
  iMem = pParse->nMem+1;
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  for(k=sqliteHashFirst(&pSchema->tblHash); k; k=sqliteHashNext(k)){
    Table *pTab = (Table*)sqliteHashData(k);
    analyzeOneTable(pParse, pTab, 0, iStatCur, iMem);
  }
  loadAnalysis(pParse, iDb);
}